

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O1

vorbis_look_floor * floor0_look(vorbis_dsp_state *vd,vorbis_info_floor *i)

{
  undefined4 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined4 *)calloc(1,0x30);
  puVar1[1] = *i;
  *puVar1 = *(undefined4 *)((long)i + 0x10);
  *(vorbis_info_floor **)(puVar1 + 6) = i;
  pvVar2 = calloc(2,8);
  *(void **)(puVar1 + 2) = pvVar2;
  return puVar1;
}

Assistant:

static vorbis_look_floor *floor0_look(vorbis_dsp_state *vd,
                                      vorbis_info_floor *i){
  vorbis_info_floor0 *info=(vorbis_info_floor0 *)i;
  vorbis_look_floor0 *look=_ogg_calloc(1,sizeof(*look));

  (void)vd;

  look->m=info->order;
  look->ln=info->barkmap;
  look->vi=info;

  look->linearmap=_ogg_calloc(2,sizeof(*look->linearmap));

  return look;
}